

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O0

int send_tcp_close(proxy_conn_handle *pc)

{
  int iVar1;
  uint8_t local_21;
  int ret;
  undefined1 auStack_1c [3];
  proxy_msg message;
  proxy_conn_priv *priv;
  proxy_conn_handle *pc_local;
  
  message._1_8_ = pc->priv;
  memset(&local_21,0,9);
  local_21 = '\x03';
  _auStack_1c = 0;
  proxy_log(pc->ph,LOG_LEVEL_DEBUG,"Sending TCP_CLOSE message to client \'%s\'\n",
            message._1_8_ + 0x10d8);
  mutex_lock((mutex_handle *)(message._1_8_ + 0x70));
  iVar1 = conn_send(*(conn_handle **)message._1_8_,&local_21,9);
  mutex_unlock((mutex_handle *)(message._1_8_ + 0x70));
  return iVar1;
}

Assistant:

static int send_tcp_close(struct proxy_conn_handle *pc)
{
	struct proxy_conn_priv *priv = pc->priv;
	struct proxy_msg message = { 0 };
	int ret;

	message.type = PROXY_MSG_TYPE_TCP_CLOSE;
	message.size = 0;

	proxy_log(pc->ph, LOG_LEVEL_DEBUG,
		  "Sending TCP_CLOSE message to client '%s'\n", priv->callsign);

	mutex_lock(&priv->mutex_client_send);

	ret = conn_send(priv->conn_client, (uint8_t *)&message,
			sizeof(struct proxy_msg));

	mutex_unlock(&priv->mutex_client_send);

	return ret;
}